

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

int nghttp2_hd_inflate_new2(nghttp2_hd_inflater **inflater_ptr,nghttp2_mem *mem)

{
  nghttp2_hd_inflater *inflater_00;
  nghttp2_hd_inflater *inflater;
  nghttp2_mem *pnStack_20;
  int rv;
  nghttp2_mem *mem_local;
  nghttp2_hd_inflater **inflater_ptr_local;
  
  pnStack_20 = mem;
  if (mem == (nghttp2_mem *)0x0) {
    pnStack_20 = nghttp2_mem_default();
  }
  inflater_00 = (nghttp2_hd_inflater *)nghttp2_mem_malloc(pnStack_20,0xf0);
  if (inflater_00 == (nghttp2_hd_inflater *)0x0) {
    inflater_ptr_local._4_4_ = -0x385;
  }
  else {
    inflater_ptr_local._4_4_ = nghttp2_hd_inflate_init(inflater_00,pnStack_20);
    if (inflater_ptr_local._4_4_ == 0) {
      *inflater_ptr = inflater_00;
      inflater_ptr_local._4_4_ = 0;
    }
    else {
      nghttp2_mem_free(pnStack_20,inflater_00);
    }
  }
  return inflater_ptr_local._4_4_;
}

Assistant:

int nghttp2_hd_inflate_new2(nghttp2_hd_inflater **inflater_ptr,
                            nghttp2_mem *mem) {
  int rv;
  nghttp2_hd_inflater *inflater;

  if (mem == NULL) {
    mem = nghttp2_mem_default();
  }

  inflater = nghttp2_mem_malloc(mem, sizeof(nghttp2_hd_inflater));

  if (inflater == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  rv = nghttp2_hd_inflate_init(inflater, mem);

  if (rv != 0) {
    nghttp2_mem_free(mem, inflater);

    return rv;
  }

  *inflater_ptr = inflater;

  return 0;
}